

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O3

shared_ptr<ASTNode> __thiscall SchemeObject::to_AST(SchemeObject *this)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  long *in_RSI;
  undefined1 local_60 [32];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  (**(code **)(*in_RSI + 0x10))(local_60);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x15a714);
  local_40 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_40 == plVar2) {
    local_30 = *plVar2;
    lStack_28 = plVar1[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar2;
  }
  local_38 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0017a350;
  __cxa_throw(this_00,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<ASTNode> SchemeObject::to_AST() const
{
    throw eval_error("Cannot evaluate " + external_repr());
}